

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# content_encoding.c
# Opt level: O1

CURLcode Curl_build_unencoding_stack(Curl_easy *data,char *enclist,int is_transfer)

{
  byte bVar1;
  curl_trc_feat *pcVar2;
  bool bVar3;
  Curl_cwriter_phase phase;
  int iVar4;
  CURLcode CVar5;
  ulong uVar6;
  size_t sVar7;
  Curl_cwriter *pCVar8;
  char *pcVar9;
  Curl_cwtype *ce;
  Curl_cwtype *pCVar10;
  ulong max;
  CURLcode unaff_R12D;
  Curl_cwtype **ppCVar11;
  byte *pbVar12;
  bool bVar13;
  Curl_cwriter *writer;
  Curl_cwtype *local_60;
  Curl_cwriter *local_40;
  ulong local_38;
  
  bVar13 = is_transfer == 0;
  local_38 = (ulong)bVar13;
  phase = bVar13 + 1 + (uint)bVar13;
  pcVar9 = "content";
  if (!bVar13) {
    pcVar9 = "transfer";
  }
LAB_0011d267:
  while (((ulong)(byte)*enclist < 0x2d &&
         ((0x100100000200U >> ((ulong)(byte)*enclist & 0x3f) & 1) != 0))) {
    enclist = (char *)((byte *)enclist + 1);
  }
  uVar6 = 1;
  max = 0;
  pbVar12 = (byte *)enclist;
  do {
    bVar1 = *pbVar12;
    if (bVar1 < 0x20) {
      if (bVar1 != 9) {
        if (bVar1 != 0) goto LAB_0011d2a7;
        break;
      }
    }
    else if (bVar1 != 0x20) {
      if (bVar1 == 0x2c) break;
LAB_0011d2a7:
      if (3 < (byte)(bVar1 - 10)) {
        max = uVar6;
      }
    }
    pbVar12 = pbVar12 + 1;
    uVar6 = uVar6 + 1;
  } while( true );
  if (max == 0) {
    bVar13 = true;
    CVar5 = unaff_R12D;
    goto LAB_0011d6c4;
  }
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) &&
     (0 < Curl_trc_feat_write.log_level)) {
    Curl_trc_write(data,"looking for %s decoder: %.*s",pcVar9,max & 0xffffffff);
  }
  if (max == 7 && is_transfer != 0) {
    iVar4 = curl_strnequal(enclist,"chunked",7);
    bVar13 = iVar4 != 0;
  }
  else {
    bVar13 = false;
  }
  if (is_transfer == 0) {
    if (((data->set).field_0x8ce & 8) == 0) goto LAB_0011d367;
LAB_0011d3b5:
    if (data == (Curl_easy *)0x0) {
LAB_0011d6bc:
      CVar5 = CURLE_OK;
    }
    else {
      bVar13 = false;
      CVar5 = CURLE_OK;
      if (((data->set).field_0x8cd & 0x10) == 0) goto LAB_0011d6c4;
      pcVar2 = (data->state).feat;
      if (pcVar2 == (curl_trc_feat *)0x0) {
        if (Curl_trc_feat_write.log_level < 1) goto LAB_0011d6bc;
      }
      else {
        CVar5 = CURLE_OK;
        if (pcVar2->log_level < 1) goto LAB_0011d6bf;
        if (Curl_trc_feat_write.log_level < 1) goto LAB_0011d6c4;
      }
      Curl_trc_write(data,"decoder not requested, ignored: %.*s",max & 0xffffffff,enclist);
LAB_0011d684:
      CVar5 = CURLE_OK;
    }
  }
  else {
    if (((byte)(data->set).field_0x8cc >> 6 & 1) == 0 && !bVar13) goto LAB_0011d3b5;
LAB_0011d367:
    sVar7 = Curl_cwriter_count(data,phase);
    if (sVar7 - 4 < 0xfffffffffffffffb) {
      bVar13 = false;
      Curl_failf(data,"Reject response due to more than %u content encodings",5);
      CVar5 = CURLE_BAD_CONTENT_ENCODING;
      goto LAB_0011d6c4;
    }
    if (((is_transfer == 0) || (iVar4 = curl_strnequal(enclist,"chunked",max), iVar4 == 0)) ||
       (local_60 = &Curl_httpchunk_unencoder, "CONNECT responded chunked"[max + 0x12] != '\0')) {
      ppCVar11 = general_unencoders;
      pCVar10 = &identity_encoding;
      local_60 = &Curl_httpchunk_unencoder;
      do {
        ppCVar11 = ppCVar11 + 1;
        iVar4 = curl_strnequal(enclist,pCVar10->name,max);
        if (((iVar4 == 0) || (pCVar10->name[max] != '\0')) &&
           ((pCVar10->alias == (char *)0x0 ||
            ((iVar4 = curl_strnequal(enclist,pCVar10->alias,max), iVar4 == 0 ||
             (pCVar10->alias[max] != '\0')))))) {
          bVar3 = true;
        }
        else {
          bVar3 = false;
          local_60 = pCVar10;
        }
        if (!bVar3) goto LAB_0011d4f2;
        pCVar10 = *ppCVar11;
      } while (pCVar10 != (Curl_cwtype *)0x0);
      local_60 = (Curl_cwtype *)0x0;
    }
LAB_0011d4f2:
    if (((bool)(local_60 != (Curl_cwtype *)0x0 & bVar13)) &&
       (pCVar8 = Curl_cwriter_get_by_type(data,local_60), pCVar8 != (Curl_cwriter *)0x0)) {
      if (data == (Curl_easy *)0x0) goto LAB_0011d6bc;
      bVar13 = false;
      CVar5 = CURLE_OK;
      if (((data->set).field_0x8cd & 0x10) == 0) goto LAB_0011d6c4;
      pcVar2 = (data->state).feat;
      if (pcVar2 == (curl_trc_feat *)0x0) {
        if (Curl_trc_feat_write.log_level < 1) goto LAB_0011d6bc;
      }
      else {
        CVar5 = CURLE_OK;
        if (pcVar2->log_level < 1) goto LAB_0011d6bf;
        if (Curl_trc_feat_write.log_level < 1) goto LAB_0011d6c4;
      }
      Curl_trc_write(data,"ignoring duplicate \'chunked\' decoder");
      goto LAB_0011d684;
    }
    if ((!bVar13 && (local_38 & 1) == 0) &&
       (pCVar8 = Curl_cwriter_get_by_name(data,"chunked"), pCVar8 != (Curl_cwriter *)0x0)) {
      bVar13 = false;
      Curl_failf(data,"Reject response due to \'chunked\' not being the last Transfer-Encoding");
      CVar5 = CURLE_BAD_CONTENT_ENCODING;
      goto LAB_0011d6c4;
    }
    if (local_60 == (Curl_cwtype *)0x0) {
      local_60 = &error_writer;
    }
    CVar5 = Curl_cwriter_create(&local_40,data,local_60,phase);
    if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
        ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level))))
       && (0 < Curl_trc_feat_write.log_level)) {
      Curl_trc_write(data,"added %s decoder %s -> %d",pcVar9,local_60->name);
    }
    if (CVar5 == CURLE_OK) {
      CVar5 = Curl_cwriter_add(data,local_40);
      if (CVar5 == CURLE_OK) {
        bVar13 = true;
        CVar5 = unaff_R12D;
      }
      else {
        Curl_cwriter_free(data,local_40);
        bVar13 = false;
      }
      goto LAB_0011d6c4;
    }
  }
LAB_0011d6bf:
  bVar13 = false;
LAB_0011d6c4:
  if (!bVar13) {
    return CVar5;
  }
  enclist = (char *)pbVar12;
  unaff_R12D = CVar5;
  if (*pbVar12 == 0) {
    return CURLE_OK;
  }
  goto LAB_0011d267;
}

Assistant:

CURLcode Curl_build_unencoding_stack(struct Curl_easy *data,
                                     const char *enclist, int is_transfer)
{
  Curl_cwriter_phase phase = is_transfer ?
    CURL_CW_TRANSFER_DECODE : CURL_CW_CONTENT_DECODE;
  CURLcode result;

  do {
    const char *name;
    size_t namelen;
    bool is_chunked = FALSE;

    /* Parse a single encoding name. */
    while(ISBLANK(*enclist) || *enclist == ',')
      enclist++;

    name = enclist;

    for(namelen = 0; *enclist && *enclist != ','; enclist++)
      if(!ISSPACE(*enclist))
        namelen = enclist - name + 1;

    if(namelen) {
      const struct Curl_cwtype *cwt;
      struct Curl_cwriter *writer;

      CURL_TRC_WRITE(data, "looking for %s decoder: %.*s",
                     is_transfer ? "transfer" : "content", (int)namelen, name);
      is_chunked = (is_transfer && (namelen == 7) &&
                    strncasecompare(name, "chunked", 7));
      /* if we skip the decoding in this phase, do not look further.
       * Exception is "chunked" transfer-encoding which always must happen */
      if((is_transfer && !data->set.http_transfer_encoding && !is_chunked) ||
         (!is_transfer && data->set.http_ce_skip)) {
        /* not requested, ignore */
        CURL_TRC_WRITE(data, "decoder not requested, ignored: %.*s",
                       (int)namelen, name);
        return CURLE_OK;
      }

      if(Curl_cwriter_count(data, phase) + 1 >= MAX_ENCODE_STACK) {
        failf(data, "Reject response due to more than %u content encodings",
              MAX_ENCODE_STACK);
        return CURLE_BAD_CONTENT_ENCODING;
      }

      cwt = find_unencode_writer(name, namelen, phase);
      if(cwt && is_chunked && Curl_cwriter_get_by_type(data, cwt)) {
        /* A 'chunked' transfer encoding has already been added.
         * Ignore duplicates. See #13451.
         * Also RFC 9112, ch. 6.1:
         * "A sender MUST NOT apply the chunked transfer coding more than
         *  once to a message body."
         */
        CURL_TRC_WRITE(data, "ignoring duplicate 'chunked' decoder");
        return CURLE_OK;
      }

      if(is_transfer && !is_chunked &&
         Curl_cwriter_get_by_name(data, "chunked")) {
        /* RFC 9112, ch. 6.1:
         * "If any transfer coding other than chunked is applied to a
         *  response's content, the sender MUST either apply chunked as the
         *  final transfer coding or terminate the message by closing the
         *  connection."
         * "chunked" must be the last added to be the first in its phase,
         *  reject this.
         */
        failf(data, "Reject response due to 'chunked' not being the last "
              "Transfer-Encoding");
        return CURLE_BAD_CONTENT_ENCODING;
      }

      if(!cwt)
        cwt = &error_writer;  /* Defer error at use. */

      result = Curl_cwriter_create(&writer, data, cwt, phase);
      CURL_TRC_WRITE(data, "added %s decoder %s -> %d",
                     is_transfer ? "transfer" : "content", cwt->name, result);
      if(result)
        return result;

      result = Curl_cwriter_add(data, writer);
      if(result) {
        Curl_cwriter_free(data, writer);
        return result;
      }
    }
  } while(*enclist);

  return CURLE_OK;
}